

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

void Abc_NtkDress2Transfer(Abc_Ntk_t *pNtk0,Abc_Ntk_t *pNtk1,Vec_Ptr_t *vRes,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int i;
  int i_00;
  uint uVar6;
  uint uVar7;
  uint local_6c;
  
  iVar3 = 0;
  iVar2 = 0;
  for (i_00 = 0; i_00 < vRes->nSize; i_00 = i_00 + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,i_00);
    pAVar4 = (Abc_Obj_t *)0x0;
    local_6c = 0;
    uVar7 = 0;
    pObj = (Abc_Obj_t *)0x0;
    for (i = 0; i < p->nSize; i = i + 1) {
      uVar1 = Vec_IntEntry(p,i);
      uVar6 = uVar1 >> 1 & 1;
      if ((uVar1 & 1) == 0) {
        pObj = Abc_NtkObj(pNtk0,(int)uVar1 >> 2);
        local_6c = uVar6;
      }
      else {
        pAVar4 = Abc_NtkObj(pNtk1,(int)uVar1 >> 2);
        uVar7 = uVar6;
      }
    }
    if (pAVar4 != (Abc_Obj_t *)0x0 && pObj != (Abc_Obj_t *)0x0) {
      pcVar5 = Nm_ManFindNameById(pNtk0->pManName,pObj->Id);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = Nm_ManFindNameById(pNtk1->pManName,pAVar4->Id);
        if (pcVar5 != (char *)0x0) {
          if (local_6c == uVar7) {
            Abc_ObjAssignName(pObj,pcVar5,(char *)0x0);
            iVar2 = iVar2 + 1;
          }
          else {
            Abc_ObjAssignName(pObj,pcVar5,"_inv");
            iVar3 = iVar3 + 1;
          }
        }
      }
    }
  }
  if (fVerbose != 0) {
    printf("Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n",
           (ulong)(uint)(iVar2 + iVar3));
    return;
  }
  return;
}

Assistant:

void Abc_NtkDress2Transfer( Abc_Ntk_t * pNtk0, Abc_Ntk_t * pNtk1, Vec_Ptr_t * vRes, int fVerbose )
{
    Vec_Int_t * vClass;
    Abc_Obj_t * pObj0, * pObj1;
    int i, k, fComp0, fComp1, Entry;
    int CounterInv = 0, Counter = 0;
    char * pName;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        pObj0 = pObj1 = NULL;
        fComp0 = fComp1 = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                pObj1 = Abc_NtkObj( pNtk1, Abc_ObjEquivId2ObjId(Entry) );
                fComp1 = Abc_ObjEquivId2Polar(Entry);
            }
            else
            {
                pObj0 = Abc_NtkObj( pNtk0, Abc_ObjEquivId2ObjId(Entry) );
                fComp0 = Abc_ObjEquivId2Polar(Entry);
            }
        }
        if ( pObj0 == NULL || pObj1 == NULL )
            continue;
        // if the node already has a name, quit
        pName = Nm_ManFindNameById( pNtk0->pManName, pObj0->Id );
        if ( pName != NULL )
            continue;
        // if the other node has no name, quit
        pName = Nm_ManFindNameById( pNtk1->pManName, pObj1->Id );
        if ( pName == NULL )
            continue;
        // assign name
        if ( fComp0 ^ fComp1 )
        {
            Abc_ObjAssignName( pObj0, pName, "_inv" );
            CounterInv++;
        }
        else
        {
            Abc_ObjAssignName( pObj0, pName, NULL );
            Counter++;
        }
    }
    if ( fVerbose )
    {
        printf( "Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n", 
            Counter + CounterInv, Counter, CounterInv );
    }
}